

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpListener.c
# Opt level: O3

sbfTcpListener_conflict
sbfTcpListener_create
          (sbfLog log,sbfMwThreadImpl *thread,sbfQueueImpl *queue,sbfTcpConnectionAddress *address,
          int isUnix,sbfTcpListenerReadyCb readyCb,sbfTcpListenerAcceptCb acceptCb,void *closure)

{
  sbfTcpListener_conflict tl;
  undefined8 uVar1;
  evconnlistener *peVar2;
  undefined4 uVar3;
  
  tl = (sbfTcpListener_conflict)sbfMemory_calloc(1,0xb8);
  tl->mLog = log;
  tl->mThread = thread;
  tl->mQueue = queue;
  tl->mReadyCb = readyCb;
  tl->mAcceptCb = acceptCb;
  tl->mClosure = closure;
  tl->mIsUnix = isUnix;
  tl->mDestroyed = 0;
  tl->mRefCount = 1;
  if (isUnix == 0) {
    sbfLog_log(log,0,"creating TCP listener %p: port %hu",tl,
               (address->sin).sin_port << 8 | (address->sin).sin_port >> 8);
    uVar3 = 0x10;
  }
  else {
    sbfLog_log(log,0,"creating TCP listener %p: unix-path %s",tl);
    uVar3 = 0x6e;
  }
  uVar1 = sbfMw_getThreadEventBase(thread);
  peVar2 = (evconnlistener *)
           evconnlistener_new_bind(uVar1,sbfTcpListenerEventCb,tl,0x1e,0xffffffff,address,uVar3);
  tl->mListener = peVar2;
  if (peVar2 == (evconnlistener *)0x0) {
    sbfLog_log(tl->mLog,3,"failed to create event listener");
    sbfTcpListener_destroy(tl);
    tl = (sbfTcpListener_conflict)0x0;
  }
  else {
    LOCK();
    (tl->mRefCount).mRefCount = (tl->mRefCount).mRefCount + 1;
    UNLOCK();
    sbfQueue_enqueue(queue,sbfTcpListenerReadyQueueCb,tl);
  }
  return tl;
}

Assistant:

sbfTcpListener
sbfTcpListener_create (sbfLog log,
                       struct sbfMwThreadImpl* thread,
                       struct sbfQueueImpl* queue,
                       sbfTcpConnectionAddress* address,
                       int isUnix,
                       sbfTcpListenerReadyCb readyCb,
                       sbfTcpListenerAcceptCb acceptCb,
                       void* closure)
{
    sbfTcpListener     tl;

    tl = xcalloc (1, sizeof *tl);
    tl->mLog = log;
    tl->mThread = thread;
    tl->mQueue = queue;

    tl->mReadyCb = readyCb;
    tl->mAcceptCb = acceptCb;
    tl->mClosure = closure;
    tl->mIsUnix = isUnix;

    tl->mDestroyed = 0;
    sbfRefCount_init (&tl->mRefCount, 1);

    if (tl->mIsUnix) {
#ifdef WIN32
        sbfLog_err (tl->mLog, "failed to create event listener unix socket not supported on windows");
        goto fail;
#else
        sbfLog_debug (tl->mLog,
                      "creating TCP listener %p: unix-path %s",
                      tl,
                      address->sun.sun_path);
        tl->mListener = evconnlistener_new_bind (sbfMw_getThreadEventBase (thread),
                                                 sbfTcpListenerEventCb,
                                                 tl,
                                                 LEV_OPT_THREADSAFE|
                                                 LEV_OPT_CLOSE_ON_FREE|
                                                 LEV_OPT_CLOSE_ON_EXEC|
                                                 LEV_OPT_REUSEABLE,
                                                 -1,
                                                 (struct sockaddr*)&(address->sun),
                                                 sizeof(address->sun));
#endif
    } else {
        sbfLog_debug (tl->mLog,
                      "creating TCP listener %p: port %hu",
                      tl,
                      ntohs (address->sin.sin_port));
        tl->mListener = evconnlistener_new_bind (sbfMw_getThreadEventBase (thread),
                                                 sbfTcpListenerEventCb,
                                                 tl,
                                                 LEV_OPT_THREADSAFE|
                                                 LEV_OPT_CLOSE_ON_FREE|
                                                 LEV_OPT_CLOSE_ON_EXEC|
                                                 LEV_OPT_REUSEABLE,
                                                 -1,
                                                 (struct sockaddr*)&(address->sin),
                                                 sizeof(address->sin));
    }
    
    if (tl->mListener == NULL)
    {
        sbfLog_err (tl->mLog, "failed to create event listener");
        goto fail;
    }

    sbfRefCount_increment (&tl->mRefCount);
    sbfQueue_enqueue (queue, sbfTcpListenerReadyQueueCb, tl);

    return tl;

fail:
    sbfTcpListener_destroy (tl);
    return NULL;
}